

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O0

void __thiscall
EthBasePort::make_bwrite_packet
          (EthBasePort *this,quadlet_t *packet,nodeid_t node,nodeaddr_t addr,quadlet_t *data,
          uint nBytes,uint tl)

{
  __uint32_t _Var1;
  uint32_t uVar2;
  size_t data_crc_offset;
  size_t data_offset;
  uint nBytes_local;
  quadlet_t *data_local;
  nodeaddr_t addr_local;
  nodeid_t node_local;
  quadlet_t *packet_local;
  EthBasePort *this_local;
  
  make_1394_header(this,packet,node,addr,1,tl);
  _Var1 = __bswap_32(nBytes << 0x10);
  packet[3] = _Var1;
  uVar2 = crc32(0,packet,0x10);
  uVar2 = BitReverse32(uVar2);
  _Var1 = __bswap_32(uVar2);
  packet[4] = _Var1;
  if (data != packet + 5) {
    (this->super_BasePort).rtWrite = false;
    memcpy(packet + 5,data,(ulong)nBytes);
  }
  uVar2 = crc32(0,packet + 5,(ulong)nBytes);
  uVar2 = BitReverse32(uVar2);
  _Var1 = __bswap_32(uVar2);
  packet[(ulong)(nBytes >> 2) + 5] = _Var1;
  return;
}

Assistant:

void EthBasePort::make_bwrite_packet(quadlet_t *packet, nodeid_t node, nodeaddr_t addr, quadlet_t *data, unsigned int nBytes, unsigned int tl)
{
    make_1394_header(packet, node, addr, EthBasePort::BWRITE, tl);
    // block length
    packet[3] = bswap_32((nBytes & 0x0000ffff) << 16);
    // header CRC
    packet[4] = bswap_32(BitReverse32(crc32(0U, (void*)packet, FW_BWRITE_HEADER_SIZE-FW_CRC_SIZE)));
    // Now, copy the data. We first check if the copy is needed.
    size_t data_offset = FW_BWRITE_HEADER_SIZE/sizeof(quadlet_t);  // data_offset = 20/4 = 5
    // Only copy data if it is not already in packet (i.e., if addresses are not equal).
    if (data != &packet[data_offset]) {
        rtWrite = false;
        memcpy(&packet[data_offset], data, nBytes);
    }
    // Now, compute the data CRC (assumes nBytes is a multiple of 4 because this is checked in WriteBlock)
    size_t data_crc_offset = data_offset + nBytes/sizeof(quadlet_t);
    packet[data_crc_offset] = bswap_32(BitReverse32(crc32(0U, static_cast<void *>(packet+data_offset), nBytes)));
#if 0 // ALTERNATIVE IMPLEMENTATION
    // CRC
    quadlet_t *fw_crc = fw_data + (nbytes/sizeof(quadlet_t));
    *fw_crc = bswap_32(BitReverse32(crc32(0U, (void*)fw_data, nbytes)));
#endif
}